

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_cart_get_(MPIABI_Fint *comm,MPIABI_Fint *maxdims,int *dims,int *periods,int *coords,
                     MPIABI_Fint *ierror)

{
  mpi_cart_get_();
  return;
}

Assistant:

void mpiabi_cart_get_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * maxdims,
  int * dims,
  int * periods,
  int * coords,
  MPIABI_Fint * ierror
) {
  return mpi_cart_get_(
    comm,
    maxdims,
    dims,
    periods,
    coords,
    ierror
  );
}